

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>::
operator()(void *this,char *value_text,vector<void_*,_std::allocator<void_*>_> *x)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *other;
  Buffer in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  ostream *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  AssertionResult local_3a0;
  string local_390;
  undefined1 local_370 [8];
  StringMatchResultListener listener;
  stringstream ss;
  ostream local_1c8 [376];
  undefined4 local_50;
  undefined1 local_40 [8];
  Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> matcher;
  vector<void_*,_std::allocator<void_*>_> *x_local;
  char *value_text_local;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void_*>_>
  *this_local;
  
  matcher.super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>.buffer_ = in_RCX;
  SafeMatcherCast<std::vector<void*,std::allocator<void*>>const&,testing::internal::UnorderedElementsAreArrayMatcher<void*>>
            ((Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)local_40,
             (testing *)value_text,(UnorderedElementsAreArrayMatcher<void_*> *)x);
  bVar1 = MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>::Matches
                    ((MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)local_40,
                     (vector<void_*,_std::allocator<void_*>_> *)
                     matcher.super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>
                     .buffer_.shared);
  if (bVar1) {
    AssertionSuccess();
    local_50 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&listener.field_0x190);
    poVar2 = std::operator<<(local_1c8,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    local_400 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1d8) {
      local_400 = local_1c8;
    }
    MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>::DescribeTo
              ((MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)local_40,
               local_400);
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_370);
    bVar1 = MatchPrintAndExplain<std::vector<void*,std::allocator<void*>>const,std::vector<void*,std::allocator<void*>>const&>
                      ((vector<void_*,_std::allocator<void_*>_> *)
                       matcher.
                       super_MatcherBase<const_std::vector<void_*,_std::allocator<void_*>_>_&>.
                       buffer_.shared,
                       (Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)local_40,
                       (MatchResultListener *)local_370);
    if (bVar1) {
      std::operator<<(local_1c8,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_1c8,"\n  Actual: ");
    StringMatchResultListener::str_abi_cxx11_(&local_390,(StringMatchResultListener *)local_370);
    std::operator<<(poVar2,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    AssertionFailure();
    std::__cxx11::stringstream::str();
    other = AssertionResult::operator<<(&local_3a0,&local_3c0);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_3c0);
    AssertionResult::~AssertionResult(&local_3a0);
    local_50 = 1;
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_370);
    std::__cxx11::stringstream::~stringstream((stringstream *)&listener.field_0x190);
  }
  Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&>::~Matcher
            ((Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)local_40);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }